

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O2

uint32_t Bernstein(char *key,int len,uint32_t seed)

{
  byte *pbVar1;
  
  pbVar1 = (byte *)(key + len);
  for (; key < pbVar1; key = (char *)((byte *)key + 1)) {
    seed = (uint)(byte)*key + seed * 0x21;
  }
  return seed;
}

Assistant:

uint32_t
Bernstein(const char *key, int len, uint32_t seed)
{
  const uint8_t  *data = (const uint8_t *)key;
  const uint8_t *const end = &data[len];
  while (data < end) {
    //seed = ((seed << 5) + seed) + *data++;
    seed = 33 * seed + *data++;
  }
  return seed;
}